

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePath.cpp
# Opt level: O1

void __thiscall
Js::TypePath::AddSingletonInstanceFieldAt(TypePath *this,PropertyIndex index,int typePathLength)

{
  byte bVar1;
  RecyclerWeakReference<Js::DynamicObject> *pRVar2;
  Data *pDVar3;
  code *pcVar4;
  bool bVar5;
  BOOLEAN BVar6;
  bool bVar7;
  uint uVar8;
  undefined4 *puVar9;
  PropertyRecord *pPVar10;
  Type pcVar11;
  undefined6 in_register_00000032;
  BVIndex i;
  uint index_00;
  
  if (((this->data).ptr)->pathLength <= index) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypePath.cpp"
                                ,0xbe,"(index < this->GetPathLength())",
                                "index < this->GetPathLength()");
    if (!bVar5) goto LAB_00e62f61;
    *puVar9 = 0;
  }
  if (typePathLength < (int)(uint)((this->data).ptr)->maxInitializedLength) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypePath.cpp"
                                ,0xbf,"(typePathLength >= this->GetMaxInitializedLength())",
                                "typePathLength >= this->GetMaxInitializedLength()");
    if (!bVar5) goto LAB_00e62f61;
    *puVar9 = 0;
  }
  if (index < ((this->data).ptr)->maxInitializedLength) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypePath.cpp"
                                ,0xc0,"(index >= this->GetMaxInitializedLength())",
                                "index >= this->GetMaxInitializedLength()");
    if (!bVar5) goto LAB_00e62f61;
    *puVar9 = 0;
  }
  i = (BVIndex)CONCAT62(in_register_00000032,index);
  BVar6 = BVStatic<128UL>::Test(&((this->data).ptr)->fixedFields,i);
  if (BVar6 == '\0') {
    BVar6 = BVStatic<128UL>::Test(&((this->data).ptr)->usedFixedFields,i);
    if (BVar6 == '\0') goto LAB_00e62e38;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar9 = 1;
  bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypePath.cpp"
                              ,0xc1,
                              "(!this->GetData()->fixedFields.Test(index) && !this->GetData()->usedFixedFields.Test(index))"
                              ,
                              "!this->GetData()->fixedFields.Test(index) && !this->GetData()->usedFixedFields.Test(index)"
                             );
  if (!bVar5) {
LAB_00e62f61:
    pcVar4 = (code *)invalidInstructionException();
    (*pcVar4)();
  }
  *puVar9 = 0;
LAB_00e62e38:
  SetMaxInitializedLength(this,i + 1);
  bVar5 = Phases::IsEnabled((Phases *)&DAT_015cd718,FixMethodPropsPhase);
  if ((bVar5) && (DAT_015d346a == '\x01')) {
    pRVar2 = (this->singletonInstance).ptr;
    if (pRVar2 == (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
      pcVar11 = (Type)0x0;
    }
    else {
      pcVar11 = (pRVar2->super_RecyclerWeakReferenceBase).strongRef;
    }
    Output::Print(L"FixedFields: TypePath::AddSingletonInstanceFieldAt: singleton = 0x%p(0x%p)\n",
                  pRVar2,pcVar11);
    Output::Print(L"   fixed fields:");
    bVar1 = ((this->data).ptr)->pathLength;
    uVar8 = (uint)bVar1;
    if (bVar1 != 0) {
      index_00 = 0;
      do {
        if (index_00 < uVar8) {
          pPVar10 = GetPropertyIdUnchecked(this,index_00);
        }
        else {
          pPVar10 = (PropertyRecord *)0x0;
        }
        pDVar3 = (this->data).ptr;
        bVar1 = pDVar3->maxInitializedLength;
        bVar5 = GetIsFixedFieldAt(this,(PropertyIndex)index_00,(uint)pDVar3->pathLength);
        bVar7 = GetIsUsedFixedFieldAt
                          (this,(PropertyIndex)index_00,(uint)((this->data).ptr)->pathLength);
        Output::Print(L" %s %d%d%d,",pPVar10 + 1,(ulong)(index_00 < bVar1),(ulong)bVar5,(ulong)bVar7
                     );
        index_00 = index_00 + 1;
        uVar8 = (uint)((this->data).ptr)->pathLength;
      } while (index_00 < uVar8);
    }
    Output::Print(L"\n");
    return;
  }
  return;
}

Assistant:

void TypePath::AddSingletonInstanceFieldAt(PropertyIndex index, int typePathLength)
    {
        Assert(index < this->GetPathLength());
        Assert(typePathLength >= this->GetMaxInitializedLength());
        Assert(index >= this->GetMaxInitializedLength());
        Assert(!this->GetData()->fixedFields.Test(index) && !this->GetData()->usedFixedFields.Test(index));

        this->SetMaxInitializedLength(index + 1);

        if (PHASE_VERBOSE_TRACE1(FixMethodPropsPhase))
        {
            Output::Print(_u("FixedFields: TypePath::AddSingletonInstanceFieldAt: singleton = 0x%p(0x%p)\n"),
                PointerValue(this->singletonInstance), this->singletonInstance != nullptr ? this->singletonInstance->Get() : nullptr);
            Output::Print(_u("   fixed fields:"));

            for (PropertyIndex i = 0; i < GetPathLength(); i++)
            {
                Output::Print(_u(" %s %d%d%d,"), GetPropertyId(i)->GetBuffer(),
                    i < GetMaxInitializedLength() ? 1 : 0,
                    GetIsFixedFieldAt(i, GetPathLength()) ? 1 : 0,
                    GetIsUsedFixedFieldAt(i, GetPathLength()) ? 1 : 0);
            }

            Output::Print(_u("\n"));
        }
    }